

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::FillColumnHorizPalCommand::Execute(FillColumnHorizPalCommand *this,DrawerThread *thread)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint8_t *puVar5;
  long lVar6;
  
  uVar1 = (uint8_t)(this->super_PalColumnHorizCommand)._color;
  uVar3 = DrawerThread::count_for_thread
                    (thread,(this->super_PalColumnHorizCommand)._yl,
                     (this->super_PalColumnHorizCommand)._count);
  if (0 < (int)uVar3) {
    uVar2 = (this->super_PalColumnHorizCommand)._x;
    puVar5 = thread->dc_temp;
    iVar4 = DrawerThread::temp_line_for_thread(thread,(this->super_PalColumnHorizCommand)._yl);
    puVar5 = puVar5 + (ulong)(uVar2 & 3) + (long)iVar4 * 4;
    if ((uVar3 & 1) != 0) {
      *puVar5 = uVar1;
      puVar5 = puVar5 + 4;
    }
    if (uVar3 != 1) {
      lVar6 = 0;
      do {
        puVar5[lVar6 * 8] = uVar1;
        puVar5[lVar6 * 8 + 4] = uVar1;
        lVar6 = lVar6 + 1;
      } while (uVar3 >> 1 != (uint)lVar6);
    }
  }
  return;
}

Assistant:

void FillColumnHorizPalCommand::Execute(DrawerThread *thread)
	{
		int count = _count;
		uint8_t color = _color;
		uint8_t *dest;

		count = thread->count_for_thread(_yl, count);
		if (count <= 0)
			return;

		int x = _x & 3;
		dest = &thread->dc_temp[x + thread->temp_line_for_thread(_yl) * 4];

		if (count & 1) {
			*dest = color;
			dest += 4;
		}
		if (!(count >>= 1))
			return;
		do {
			dest[0] = color; dest[4] = color;
			dest += 8;
		} while (--count);
	}